

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::fixRedefinedSchema
          (TraverseSchema *this,DOMElement *elem,SchemaInfo *redefinedSchemaInfo,
          XMLCh *redefineChildComponentName,XMLCh *redefineChildTypeName,int redefineNameCounter)

{
  SchemaInfo *redefinedSchemaInfo_00;
  XMLStringPool *pXVar1;
  XMLStringPool *pXVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  DOMNode *parent;
  XMLCh *pXVar7;
  undefined4 extraout_var;
  uint infoItemNameId;
  XMLCh *newInfoItemName;
  SchemaInfo *reRedefinedSchemaInfo;
  XMLCh *infoItemName_1;
  XMLCh *redefName;
  DOMElement *redefChild;
  XMLCh *infoItemName;
  XMLCh *name;
  DOMElement *child;
  bool foundIt;
  int redefineNameCounter_local;
  XMLCh *redefineChildTypeName_local;
  XMLCh *redefineChildComponentName_local;
  SchemaInfo *redefinedSchemaInfo_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  bVar4 = false;
  parent = &SchemaInfo::getRoot(redefinedSchemaInfo)->super_DOMNode;
  name = (XMLCh *)XUtil::getFirstChildElement(parent);
  restoreSchemaInfo(this,redefinedSchemaInfo,INCLUDE,0xfffffffe);
  do {
    if (name == (XMLCh *)0x0) {
LAB_00440d82:
      if (!bVar4) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x7d,redefineChildTypeName,
                          (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      return;
    }
    pXVar7 = (XMLCh *)(**(code **)(*(long *)name + 0xc0))();
    bVar3 = XMLString::equals(pXVar7,redefineChildComponentName);
    if (bVar3) {
      pXVar7 = getElementAttValue(this,(DOMElement *)name,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName)
      ;
      bVar3 = XMLString::equals(pXVar7,redefineChildTypeName);
      if (bVar3) {
        bVar4 = true;
        getRedefineNewTypeName(this,pXVar7,redefineNameCounter,&this->fBuffer);
        pXVar7 = XMLBuffer::getRawBuffer(&this->fBuffer);
        (**(code **)(*(long *)name + 0x160))(name,SchemaSymbols::fgATT_NAME,pXVar7);
        goto LAB_00440d82;
      }
    }
    else {
      bVar3 = XMLString::equals(pXVar7,(XMLCh *)SchemaSymbols::fgELT_REDEFINE);
      if (bVar3) {
        for (redefName = (XMLCh *)XUtil::getFirstChildElement((DOMNode *)name);
            redefName != (XMLCh *)0x0;
            redefName = (XMLCh *)XUtil::getNextSiblingElement((DOMNode *)redefName)) {
          pXVar7 = (XMLCh *)(**(code **)(*(long *)redefName + 0xc0))();
          bVar3 = XMLString::equals(pXVar7,redefineChildComponentName);
          if (bVar3) {
            pXVar7 = getElementAttValue(this,(DOMElement *)redefName,
                                        (XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
            bVar3 = XMLString::equals(pXVar7,redefineChildTypeName);
            if (bVar3) {
              bVar4 = openRedefinedSchema(this,(DOMElement *)name);
              if (!bVar4) {
                SchemaInfo::addFailedRedefine(redefinedSchemaInfo,(DOMElement *)name);
                return;
              }
              bVar4 = true;
              redefinedSchemaInfo_00 = this->fSchemaInfo;
              bVar3 = validateRedefineNameChange
                                (this,(DOMElement *)redefName,redefineChildComponentName,
                                 redefineChildTypeName,redefineNameCounter + 1,redefinedSchemaInfo);
              if (bVar3) {
                fixRedefinedSchema(this,(DOMElement *)redefName,redefinedSchemaInfo_00,
                                   redefineChildComponentName,redefineChildTypeName,
                                   redefineNameCounter + 1);
                getRedefineNewTypeName(this,pXVar7,redefineNameCounter,&this->fBuffer);
                pXVar2 = this->fStringPool;
                pXVar1 = this->fStringPool;
                pXVar7 = XMLBuffer::getRawBuffer(&this->fBuffer);
                uVar5 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,pXVar7);
                iVar6 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])
                                  (pXVar2,(ulong)uVar5);
                (**(code **)(*(long *)redefName + 0x160))
                          (redefName,SchemaSymbols::fgATT_NAME,(XMLCh *)CONCAT44(extraout_var,iVar6)
                          );
                XMLBuffer::set(&this->fBuffer,this->fTargetNSURIString);
                XMLBuffer::append(&this->fBuffer,L',');
                XMLBuffer::append(&this->fBuffer,(XMLCh *)CONCAT44(extraout_var,iVar6));
              }
              else {
                fixRedefinedSchema(this,(DOMElement *)redefName,redefinedSchemaInfo_00,
                                   redefineChildComponentName,redefineChildTypeName,
                                   redefineNameCounter);
                SchemaInfo::addFailedRedefine(redefinedSchemaInfo,(DOMElement *)redefName);
                XMLBuffer::set(&this->fBuffer,this->fTargetNSURIString);
                XMLBuffer::append(&this->fBuffer,L',');
                XMLBuffer::append(&this->fBuffer,pXVar7);
              }
              pXVar2 = this->fStringPool;
              pXVar7 = XMLBuffer::getRawBuffer(&this->fBuffer);
              iVar6 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,pXVar7);
              bVar3 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey
                                (this->fRedefineComponents,redefineChildComponentName,iVar6);
              if (!bVar3) {
                RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                          (this->fRedefineComponents,redefineChildComponentName,iVar6,
                           (char16_t *)0x0);
              }
              break;
            }
          }
        }
        if (bVar4) goto LAB_00440d82;
      }
    }
    name = (XMLCh *)XUtil::getNextSiblingElement((DOMNode *)name);
  } while( true );
}

Assistant:

void TraverseSchema::fixRedefinedSchema(const DOMElement* const elem,
                                        SchemaInfo* const redefinedSchemaInfo,
                                        const XMLCh* const redefineChildComponentName,
                                        const XMLCh* const redefineChildTypeName,
                                        const int redefineNameCounter) {

    bool foundIt = false;
    DOMElement* child = XUtil::getFirstChildElement(redefinedSchemaInfo->getRoot());

    restoreSchemaInfo(redefinedSchemaInfo);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* name = child->getLocalName();

        if (XMLString::equals(name, redefineChildComponentName)) {

            const XMLCh* infoItemName = getElementAttValue(child, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

            if(!XMLString::equals(infoItemName, redefineChildTypeName)) {
                continue;
            }
            else { // found it!

                // now we have to do the renaming...
                foundIt = true;
                getRedefineNewTypeName(infoItemName, redefineNameCounter, fBuffer);
                child->setAttribute(SchemaSymbols::fgATT_NAME, fBuffer.getRawBuffer());
                break;
            }
        }
        else if (XMLString::equals(name, SchemaSymbols::fgELT_REDEFINE)) { // need to search the redefine decl...

            for (DOMElement* redefChild = XUtil::getFirstChildElement(child);
                 redefChild != 0;
                 redefChild = XUtil::getNextSiblingElement(redefChild)) {

                const XMLCh* redefName = redefChild->getLocalName();

                if (XMLString::equals(redefName, redefineChildComponentName)) {

                    const XMLCh* infoItemName = getElementAttValue(redefChild, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

                    if(!XMLString::equals(infoItemName, redefineChildTypeName)) {
                        continue;
                    }
                    else { // found it!

                        if (!openRedefinedSchema(child)) {

                            redefinedSchemaInfo->addFailedRedefine(child);
                            return;
                        }

                        foundIt = true;

                        SchemaInfo* reRedefinedSchemaInfo = fSchemaInfo;

                        if (validateRedefineNameChange(redefChild, redefineChildComponentName, redefineChildTypeName, redefineNameCounter + 1, redefinedSchemaInfo)) {

                            fixRedefinedSchema(redefChild, reRedefinedSchemaInfo, redefineChildComponentName, redefineChildTypeName, redefineNameCounter + 1);

                            // now we have to do the renaming...
                            getRedefineNewTypeName(infoItemName, redefineNameCounter, fBuffer);
                            const XMLCh* newInfoItemName = fStringPool->getValueForId(fStringPool->addOrFind(fBuffer.getRawBuffer()));
                            redefChild->setAttribute(SchemaSymbols::fgATT_NAME, newInfoItemName);

                            // and we now know we will traverse this, so set fRedefineComponents appropriately...
                            fBuffer.set(fTargetNSURIString);
                            fBuffer.append(chComma);
                            fBuffer.append(newInfoItemName);
                        }
                        else {

                            fixRedefinedSchema(redefChild, reRedefinedSchemaInfo, redefineChildComponentName, redefineChildTypeName, redefineNameCounter);
                            redefinedSchemaInfo->addFailedRedefine(redefChild);

                            // and we now know we will traverse this, so set fRedefineComponents appropriately...
                            fBuffer.set(fTargetNSURIString);
                            fBuffer.append(chComma);
                            fBuffer.append(infoItemName);
                        }

                        unsigned int infoItemNameId = fStringPool->addOrFind(fBuffer.getRawBuffer());

                        if (!fRedefineComponents->containsKey(redefineChildComponentName, infoItemNameId)) {
                            fRedefineComponents->put((void*) redefineChildComponentName, infoItemNameId, 0);
                        }

                        break;
                    }
                }
            } //for

            if (foundIt) {
                break;
            }
        }
    } //for

    if(!foundIt) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_DeclarationNotFound, redefineChildTypeName);
    }
}